

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::ErrorErrorCategory::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int condition)

{
  allocator local_1e;
  allocator local_1d;
  int local_1c;
  void *pvStack_18;
  int condition_local;
  ErrorErrorCategory *this_local;
  
  local_1c = condition;
  pvStack_18 = this;
  this_local = (ErrorErrorCategory *)__return_storage_ptr__;
  if (condition == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Multiple errors",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else {
    if (condition != 2) {
      llvm::llvm_unreachable_internal
                ("Unhandled error code",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Error.cpp"
                 ,0x29);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "Inconvertible error value. An error has occurred that could not be converted to a known std::error_code. Please file a bug."
               ,&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string message(int condition) const override {
      switch (static_cast<ErrorErrorCode>(condition)) {
      case ErrorErrorCode::MultipleErrors:
        return "Multiple errors";
      case ErrorErrorCode::InconvertibleError:
        return "Inconvertible error value. An error has occurred that could "
               "not be converted to a known std::error_code. Please file a "
               "bug.";
      }
      llvm_unreachable("Unhandled error code");
    }